

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

LPSTR CharNextA(LPCSTR lpsz)

{
  UINT UVar1;
  LPSTR pCVar2;
  LPSTR pRet;
  LPCSTR lpsz_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  UVar1 = GetACP();
  pCVar2 = CharNextExA((WORD)UVar1,lpsz,0);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pCVar2;
  }
  abort();
}

Assistant:

LPSTR
PALAPI
CharNextA(
  IN LPCSTR lpsz)
{
    LPSTR pRet;
    PERF_ENTRY(CharNextA);
    ENTRY("CharNextA (lpsz=%p (%s))\n", lpsz?lpsz:NULL, lpsz?lpsz:NULL);

    pRet = CharNextExA(GetACP(), lpsz, 0);

    LOGEXIT ("CharNextA returns LPSTR %p\n", pRet);
    PERF_EXIT(CharNextA);
    return pRet;
}